

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O1

JSValue js_string_iterator_next
                  (JSContext *ctx,JSValue this_val,int argc,JSValue *argv,BOOL *pdone,int magic)

{
  int iVar1;
  JSString *p;
  undefined1 auVar2 [16];
  uint uVar3;
  undefined8 *puVar4;
  JSValueUnion JVar5;
  int64_t iVar6;
  ulong uVar7;
  JSValue v;
  JSValue JVar8;
  JSValue JVar9;
  uint32_t idx;
  JSValueUnion local_40;
  uint local_34;
  
  puVar4 = (undefined8 *)JS_GetOpaque2(ctx,this_val,0x26);
  if (puVar4 == (undefined8 *)0x0) {
    *pdone = 0;
    uVar7 = 6;
  }
  else {
    iVar6 = puVar4[1];
    uVar3 = (uint)iVar6;
    if (uVar3 != 3) {
      p = (JSString *)*puVar4;
      local_34 = *(uint *)((long)puVar4 + 0x14);
      uVar7 = (ulong)local_34;
      if (local_34 < (*(uint *)&p->field_0x4 & 0x7fffffff)) {
        uVar3 = string_getc(p,(int *)&local_34);
        *(uint *)((long)puVar4 + 0x14) = local_34;
        *pdone = 0;
        if (uVar3 < 0x10000) {
          JVar8 = js_new_string_char(ctx,(uint16_t)uVar3);
        }
        else {
          JVar5.ptr = js_alloc_string(ctx,2,1);
          if ((JSString *)JVar5.ptr == (JSString *)0x0) {
            local_40.float64 = local_40.float64 & 0xffffffff00000000;
            iVar6 = 6;
          }
          else {
            (((JSString *)((long)JVar5.ptr + 0x10))->header).ref_count =
                 *(int *)((long)&p[1].header.ref_count + uVar7 * 2);
            iVar6 = -7;
            local_40.ptr = JVar5.ptr;
          }
          JVar8.tag = iVar6;
          JVar8.u.ptr = local_40.ptr;
        }
        uVar7 = (ulong)JVar8.u.ptr & 0xffffffff00000000;
        goto LAB_0016c472;
      }
      JVar5.ptr = (void *)*puVar4;
      if ((0xfffffff4 < uVar3) && (iVar1 = *JVar5.ptr, *(int *)JVar5.ptr = iVar1 + -1, iVar1 < 2)) {
        v.tag = iVar6;
        v.u.ptr = JVar5.ptr;
        __JS_FreeValueRT(ctx->rt,v);
      }
      *(undefined4 *)puVar4 = 0;
      puVar4[1] = 3;
    }
    *pdone = 1;
    uVar7 = 3;
  }
  auVar2._8_8_ = 0;
  auVar2._0_8_ = uVar7;
  JVar8 = (JSValue)(auVar2 << 0x40);
  uVar7 = 0;
LAB_0016c472:
  JVar9.tag = JVar8.tag;
  JVar9.u.ptr = (void *)(JVar8.u._0_4_ | uVar7);
  return JVar9;
}

Assistant:

static JSValue js_string_iterator_next(JSContext *ctx, JSValueConst this_val,
                                       int argc, JSValueConst *argv,
                                       BOOL *pdone, int magic)
{
    JSArrayIteratorData *it;
    uint32_t idx, c, start;
    JSString *p;

    it = JS_GetOpaque2(ctx, this_val, JS_CLASS_STRING_ITERATOR);
    if (!it) {
        *pdone = FALSE;
        return JS_EXCEPTION;
    }
    if (JS_IsUndefined(it->obj))
        goto done;
    p = JS_VALUE_GET_STRING(it->obj);
    idx = it->idx;
    if (idx >= p->len) {
        JS_FreeValue(ctx, it->obj);
        it->obj = JS_UNDEFINED;
    done:
        *pdone = TRUE;
        return JS_UNDEFINED;
    }

    start = idx;
    c = string_getc(p, (int *)&idx);
    it->idx = idx;
    *pdone = FALSE;
    if (c <= 0xffff) {
        return js_new_string_char(ctx, c);
    } else {
        return js_new_string16(ctx, p->u.str16 + start, 2);
    }
}